

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readxm.c
# Opt level: O3

void * safe_realloc(void *ptr,size_t size)

{
  void *pvVar1;
  
  if (ptr == (void *)0x0) {
    pvVar1 = malloc(size);
    return pvVar1;
  }
  if ((size != 0) && (pvVar1 = realloc(ptr,size), pvVar1 != (void *)0x0)) {
    return pvVar1;
  }
  free(ptr);
  return (void *)0x0;
}

Assistant:

static void *safe_realloc(void *ptr, size_t size)
{
	if (ptr == NULL)
		return malloc(size);

	if (size == 0) {
		free(ptr);
		return NULL;
	} else {
		void *new_block = realloc(ptr, size);
		if (!new_block)
			free(ptr);
		return new_block;
	}
}